

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

UBool __thiscall
icu_63::StringTrieBuilder::ListBranchNode::operator==(ListBranchNode *this,Node *other)

{
  uint uVar1;
  UBool UVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this == (ListBranchNode *)other) {
    return '\x01';
  }
  UVar2 = Node::operator==((Node *)this,other);
  uVar4 = 0;
  if (UVar2 != '\0') {
    uVar1 = this->length;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    do {
      uVar3 = uVar4;
      if (((uVar5 == uVar3) ||
          (this->units[uVar3] != *(char16_t *)((long)&other[5].hash + uVar3 * 2))) ||
         (this->values[uVar3] !=
          *(int *)((long)&other[4].super_UObject._vptr_UObject + uVar3 * 4 + 4))) break;
      uVar4 = uVar3 + 1;
    } while (this->equal[uVar3] == *(Node **)(&other[1].hash + uVar3 * 2));
    uVar4 = (ulong)((long)(int)uVar1 <= (long)uVar3);
  }
  return (UBool)uVar4;
}

Assistant:

UBool
StringTrieBuilder::ListBranchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const ListBranchNode &o=(const ListBranchNode &)other;
    for(int32_t i=0; i<length; ++i) {
        if(units[i]!=o.units[i] || values[i]!=o.values[i] || equal[i]!=o.equal[i]) {
            return FALSE;
        }
    }
    return TRUE;
}